

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s.c
# Opt level: O2

void Hacl_Hash_Blake2s_hash_with_key
               (uint8_t *output,uint32_t output_len,uint8_t *input,uint32_t input_len,uint8_t *key,
               uint32_t key_len)

{
  uint32_t b1 [16];
  uint local_68 [18];
  
  b1[0xc] = 0;
  b1[0xd] = 0;
  b1[0xe] = 0;
  b1[0xf] = 0;
  b1[8] = 0;
  b1[9] = 0;
  b1[10] = 0;
  b1[0xb] = 0;
  b1[4] = 0;
  b1[5] = 0;
  b1[6] = 0;
  b1[7] = 0;
  b1[0] = 0;
  b1[1] = 0;
  b1[2] = 0;
  b1[3] = 0;
  local_68[9] = 0xbb67ae85;
  local_68[10] = 0x3c6ef372;
  local_68[0xb] = 0xa54ff53a;
  local_68[0xc] = 0x510e527f;
  local_68[0xd] = 0x9b05688c;
  local_68[0xe] = 0x1f83d9ab;
  local_68[0xf] = 0x5be0cd19;
  local_68[0] = ((key_len & 0xff) << 8 | output_len & 0xff) ^ 0x6b08e667;
  local_68[1] = 0xbb67ae85;
  local_68[2] = 0x3c6ef372;
  local_68[3] = 0xa54ff53a;
  local_68[4] = 0x510e527f;
  local_68[5] = 0x9b05688c;
  local_68[6] = 0x1f83d9ab;
  local_68[7] = 0x5be0cd19;
  local_68[8] = 0x6a09e667;
  update(b1,local_68,key_len,key,input_len,input);
  Hacl_Hash_Blake2s_finish(output_len,output,local_68);
  Lib_Memzero0_memzero0(b1,0x40);
  Lib_Memzero0_memzero0(local_68,0x40);
  return;
}

Assistant:

void
Hacl_Hash_Blake2s_hash_with_key(
  uint8_t *output,
  uint32_t output_len,
  uint8_t *input,
  uint32_t input_len,
  uint8_t *key,
  uint32_t key_len
)
{
  uint32_t b[16U] = { 0U };
  uint32_t b1[16U] = { 0U };
  Hacl_Hash_Blake2s_init(b, key_len, output_len);
  update(b1, b, key_len, key, input_len, input);
  Hacl_Hash_Blake2s_finish(output_len, output, b);
  Lib_Memzero0_memzero(b1, 16U, uint32_t, void *);
  Lib_Memzero0_memzero(b, 16U, uint32_t, void *);
}